

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitGetIterator(RegSlot iteratorReg,RegSlot iterableReg,ByteCodeGenerator *byteCodeGenerator,
                    FuncInfo *funcInfo)

{
  uint cacheId;
  
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,iterableReg,0x14,true,false);
  Js::ByteCodeWriter::PatchableProperty
            (&byteCodeGenerator->m_writer,LdMethodFld,iteratorReg,iterableReg,cacheId,false,true);
  EmitFunctionCall(iteratorReg,iteratorReg,iterableReg,0xffffffff,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(iteratorReg,byteCodeGenerator);
  return;
}

Assistant:

void EmitGetIterator(
    Js::RegSlot iteratorReg,
    Js::RegSlot iterableReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitGetObjectMethod(
        iteratorReg,
        iterableReg,
        Js::PropertyIds::_symbolIterator,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(iteratorReg, iteratorReg, iterableReg, byteCodeGenerator, funcInfo);
    EmitThrowOnNotObject(iteratorReg, byteCodeGenerator);
}